

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O3

mbedtls_asn1_named_data *
mbedtls_asn1_find_named_data(mbedtls_asn1_named_data *list,char *oid,size_t len)

{
  int iVar1;
  
  if (list != (mbedtls_asn1_named_data *)0x0) {
    do {
      if (((list->oid).len == len) && (iVar1 = bcmp((list->oid).p,oid,len), iVar1 == 0)) {
        return list;
      }
      list = list->next;
    } while (list != (mbedtls_asn1_named_data *)0x0);
  }
  return (mbedtls_asn1_named_data *)0x0;
}

Assistant:

const mbedtls_asn1_named_data *mbedtls_asn1_find_named_data(const mbedtls_asn1_named_data *list,
                                                            const char *oid, size_t len)
{
    while (list != NULL) {
        if (list->oid.len == len &&
            memcmp(list->oid.p, oid, len) == 0) {
            break;
        }

        list = list->next;
    }

    return list;
}